

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

void duckdb_je_tsd_global_slow_inc(tsdn_t *tsdn)

{
  LOCK();
  tsd_global_slow_count.repr = tsd_global_slow_count.repr + 1;
  UNLOCK();
  tsd_force_recompute((tsdn_t *)0x0);
  return;
}

Assistant:

void
tsd_global_slow_inc(tsdn_t *tsdn) {
	atomic_fetch_add_u32(&tsd_global_slow_count, 1, ATOMIC_RELAXED);
	/*
	 * We unconditionally force a recompute, even if the global slow count
	 * was already positive.  If we didn't, then it would be possible for us
	 * to return to the user, have the user synchronize externally with some
	 * other thread, and then have that other thread not have picked up the
	 * update yet (since the original incrementing thread might still be
	 * making its way through the tsd list).
	 */
	tsd_force_recompute(tsdn);
}